

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

void __thiscall
pica::Grid<(pica::Dimension)1,_double>::Grid
          (Grid<(pica::Dimension)1,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  Array1d<double>::Array1d(&this->exData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->eyData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->ezData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->bxData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->byData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->bzData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->jxData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->jyData,(IndexType_conflict1)size->x,0.0);
  Array1d<double>::Array1d(&this->jzData,(IndexType_conflict1)size->x,0.0);
  (this->origin).x = origin->x;
  (this->step).x = step->x;
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}